

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O2

void __thiscall higan::HttpResponse::EncodeToBuffer(HttpResponse *this,Buffer *buffer)

{
  Buffer *this_00;
  FileForRead *this_01;
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  _Base_ptr p_Var4;
  StatusCode in_EDX;
  char local_a8 [8];
  char line_buff [64];
  string local_58;
  allocator<char> local_31;
  
  if (buffer != (Buffer *)0x0) {
    StatusCodeToString_abi_cxx11_(&local_58,(HttpResponse *)(ulong)this->status_code_,in_EDX);
    iVar1 = snprintf(local_a8,0x40,"HTTP/1.1 %s\r\n",local_58._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_58);
    Buffer::Append(buffer,local_a8,(long)iVar1);
    if (this->close_connection_ == true) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"Connection: close\r\n",&local_31);
      Buffer::Append(buffer,&local_58);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"Connection: Keep-Alive\r\n",&local_31);
      Buffer::Append(buffer,&local_58);
    }
    std::__cxx11::string::~string((string *)&local_58);
    this_00 = &this->body_buffer_;
    sVar2 = Buffer::ReadableSize(this_00);
    this_01 = (this->file_ptr_).super___shared_ptr<higan::FileForRead,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    if (this_01 != (FileForRead *)0x0) {
      sVar3 = FileForRead::GetFileSize(this_01);
      sVar2 = sVar2 + sVar3;
    }
    iVar1 = snprintf(local_a8,0x40,"Content-Length: %zd\r\n",sVar2);
    Buffer::Append(buffer,local_a8,(long)iVar1);
    line_buff._56_8_ = this;
    for (p_Var4 = (this->header_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(this->header_map_)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      Buffer::Append(buffer,(string *)(p_Var4 + 1));
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,": ",&local_31);
      Buffer::Append(buffer,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      Buffer::Append(buffer,(string *)(p_Var4 + 2));
      Buffer::AppendCRLF(buffer);
    }
    Buffer::AppendCRLF(buffer);
    Buffer::Append(buffer,this_00);
    if (*(long *)(line_buff._56_8_ + 0x60) != 0) {
      Buffer::Append(buffer,this_00);
    }
  }
  return;
}

Assistant:

void HttpResponse::EncodeToBuffer(Buffer* buffer)
{
	if (!buffer)
	{
		return;
	}

	char line_buff[64];
	int len = snprintf(line_buff, sizeof line_buff, "HTTP/1.1 %s\r\n", StatusCodeToString(status_code_).c_str());
	buffer->Append(line_buff, len);

	if (close_connection_)
	{
		buffer->Append("Connection: close\r\n");
	}
	else
	{
		buffer->Append("Connection: Keep-Alive\r\n");
	}

	size_t body_size = body_buffer_.ReadableSize();
	if (file_ptr_)
	{
		body_size += file_ptr_->GetFileSize();
	}

	len = snprintf(line_buff, sizeof line_buff, "Content-Length: %zd\r\n", body_size);
	buffer->Append(line_buff, len);


	for (const auto& kv : header_map_)
	{
		buffer->Append(kv.first);
		buffer->Append(": ");
		buffer->Append(kv.second);
		buffer->AppendCRLF();
	}

	buffer->AppendCRLF();

	buffer->Append(&body_buffer_);
	if (file_ptr_)
	{
		buffer->Append(&body_buffer_);
	}
}